

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::GenerateInterfaceMembers
          (ImmutableMapFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  JavaType JVar1;
  FieldDescriptor *field;
  char *text;
  char *text_00;
  char *local_40;
  char *local_38;
  
  WriteFieldDocComment(printer,this->descriptor_);
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"$deprecation$int ${$get$capitalized_name$Count$}$();\n");
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$boolean ${$contains$capitalized_name$$}$(\n    $key_type$ key);\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  field = anon_unknown_1::ValueField(this->descriptor_);
  JVar1 = GetJavaType(field);
  if (JVar1 == JAVATYPE_ENUM) {
    io::Printer::Print(printer,variables,
                       "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Deprecated\njava.util.Map<$boxed_key_type$, $value_enum_type$>\n${$get$capitalized_name$$}$();\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,variables,
                       "$deprecation$java.util.Map<$boxed_key_type$, $value_enum_type$>\n${$get$capitalized_name$Map$}$();\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,variables,
                       "$deprecation$$value_enum_type$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_enum_type$ defaultValue);\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,variables,
                       "$deprecation$$value_enum_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key);\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    if (*(int *)(*(long *)(this->descriptor_ + 0x28) + 0x3c) != 3) {
      return;
    }
    local_38 = 
    "$deprecation$\n$value_type$ ${$get$capitalized_name$ValueOrThrow$}$(\n    $key_type$ key);\n";
    local_40 = 
    "$deprecation$\n$value_type$ ${$get$capitalized_name$ValueOrDefault$}$(\n    $key_type$ key,\n    $value_type$ defaultValue);\n"
    ;
    text_00 = 
    "$deprecation$java.util.Map<$type_parameters$>\n${$get$capitalized_name$ValueMap$}$();\n";
    text = 
    "/**\n * Use {@link #get$capitalized_name$ValueMap()} instead.\n */\n@java.lang.Deprecated\njava.util.Map<$type_parameters$>\n${$get$capitalized_name$Value$}$();\n"
    ;
  }
  else {
    local_38 = 
    "$deprecation$\n$value_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key);\n";
    local_40 = 
    "$deprecation$\n$value_type$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_type$ defaultValue);\n"
    ;
    text_00 = "$deprecation$java.util.Map<$type_parameters$>\n${$get$capitalized_name$Map$}$();\n";
    text = 
    "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Deprecated\njava.util.Map<$type_parameters$>\n${$get$capitalized_name$$}$();\n"
    ;
  }
  io::Printer::Print(printer,variables,text);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,text_00);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,local_40);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,local_38);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  return;
}

Assistant:

void ImmutableMapFieldLiteGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
                 "$deprecation$int ${$get$capitalized_name$Count$}$();\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
                 "$deprecation$boolean ${$contains$capitalized_name$$}$(\n"
                 "    $key_type$ key);\n");
  printer->Annotate("{", "}", descriptor_);
  if (GetJavaType(ValueField(descriptor_)) == JAVATYPE_ENUM) {
    printer->Print(variables_,
                   "/**\n"
                   " * Use {@link #get$capitalized_name$Map()} instead.\n"
                   " */\n"
                   "@java.lang.Deprecated\n"
                   "java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
                   "${$get$capitalized_name$$}$();\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
        "${$get$capitalized_name$Map$}$();\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$$value_enum_type$ ${$get$capitalized_name$OrDefault$}$(\n"
        "    $key_type$ key,\n"
        "    $value_enum_type$ defaultValue);\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$$value_enum_type$ ${$get$capitalized_name$OrThrow$}$(\n"
        "    $key_type$ key);\n");
    printer->Annotate("{", "}", descriptor_);
    if (SupportUnknownEnumValue(descriptor_->file())) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use {@link #get$capitalized_name$ValueMap()} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "java.util.Map<$type_parameters$>\n"
          "${$get$capitalized_name$Value$}$();\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(variables_,
                     "$deprecation$java.util.Map<$type_parameters$>\n"
                     "${$get$capitalized_name$ValueMap$}$();\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(variables_,
                     "$deprecation$\n"
                     "$value_type$ ${$get$capitalized_name$ValueOrDefault$}$(\n"
                     "    $key_type$ key,\n"
                     "    $value_type$ defaultValue);\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(variables_,
                     "$deprecation$\n"
                     "$value_type$ ${$get$capitalized_name$ValueOrThrow$}$(\n"
                     "    $key_type$ key);\n");
      printer->Annotate("{", "}", descriptor_);
    }
  } else {
    printer->Print(variables_,
                   "/**\n"
                   " * Use {@link #get$capitalized_name$Map()} instead.\n"
                   " */\n"
                   "@java.lang.Deprecated\n"
                   "java.util.Map<$type_parameters$>\n"
                   "${$get$capitalized_name$$}$();\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
                   "$deprecation$java.util.Map<$type_parameters$>\n"
                   "${$get$capitalized_name$Map$}$();\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
                   "$deprecation$\n"
                   "$value_type$ ${$get$capitalized_name$OrDefault$}$(\n"
                   "    $key_type$ key,\n"
                   "    $value_type$ defaultValue);\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
                   "$deprecation$\n"
                   "$value_type$ ${$get$capitalized_name$OrThrow$}$(\n"
                   "    $key_type$ key);\n");
    printer->Annotate("{", "}", descriptor_);
  }
}